

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStructTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ShaderStructCase::init(ShaderStructCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *context;
  ContextInfo *contextInfo;
  int iVar1;
  Archive *archive;
  Texture2D *pTVar2;
  Vector<float,_4> local_a4;
  Sampler local_94;
  TextureBinding local_58;
  ShaderStructCase *local_10;
  ShaderStructCase *this_local;
  
  local_10 = this;
  if ((this->m_usesTexture & 1U) != 0) {
    context = (this->super_ShaderRenderCase).m_renderCtx;
    contextInfo = (this->super_ShaderRenderCase).m_ctxInfo;
    archive = tcu::TestContext::getArchive
                        ((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx);
    pTVar2 = glu::Texture2D::create(context,contextInfo,archive,"data/brick.png");
    this->m_brickTexture = pTVar2;
    pTVar2 = this->m_brickTexture;
    tcu::Vector<float,_4>::Vector(&local_a4,0.0,0.0,0.0,0.0);
    tcu::Sampler::Sampler
              (&local_94,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,LINEAR,LINEAR,0.0,true,
               COMPAREMODE_NONE,0,&local_a4,false,MODE_DEPTH);
    deqp::gls::TextureBinding::TextureBinding(&local_58,pTVar2,&local_94);
    ctx = (EVP_PKEY_CTX *)&local_58;
    std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::push_back
              (&(this->super_ShaderRenderCase).m_textures,(value_type *)ctx);
  }
  iVar1 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx);
  return iVar1;
}

Assistant:

void ShaderStructCase::init (void)
{
	if (m_usesTexture)
	{
		m_brickTexture = glu::Texture2D::create(m_renderCtx, m_ctxInfo, m_testCtx.getArchive(), "data/brick.png");
		m_textures.push_back(TextureBinding(m_brickTexture, tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
																		 tcu::Sampler::LINEAR, tcu::Sampler::LINEAR)));
		DE_ASSERT(m_textures.size() == 1);
	}
	gls::ShaderRenderCase::init();
}